

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

ArrayCopy * __thiscall
wasm::Builder::makeArrayCopy
          (Builder *this,Expression *destRef,Expression *destIndex,Expression *srcRef,
          Expression *srcIndex,Expression *length)

{
  ArrayCopy *pAVar1;
  
  pAVar1 = MixedArena::alloc<wasm::ArrayCopy>(&this->wasm->allocator);
  pAVar1->destRef = destRef;
  pAVar1->destIndex = destIndex;
  pAVar1->srcRef = srcRef;
  pAVar1->srcIndex = srcIndex;
  pAVar1->length = length;
  ::wasm::ArrayCopy::finalize();
  return pAVar1;
}

Assistant:

ArrayCopy* makeArrayCopy(Expression* destRef,
                           Expression* destIndex,
                           Expression* srcRef,
                           Expression* srcIndex,
                           Expression* length) {
    auto* ret = wasm.allocator.alloc<ArrayCopy>();
    ret->destRef = destRef;
    ret->destIndex = destIndex;
    ret->srcRef = srcRef;
    ret->srcIndex = srcIndex;
    ret->length = length;
    ret->finalize();
    return ret;
  }